

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

Shape * __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::MakeLoop(wasm::InsertOrderedSet<CFG::Block*>&,wasm
::InsertOrderedSet<CFG::Block*>&,wasm::InsertOrderedSet<CFG::Block_>__
          (void *this,BlockSet *Blocks,BlockSet *Entries,BlockSet *NextEntries)

{
  list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *plVar1;
  _Hash_node_base *p_Var2;
  __node_base_ptr p_Var3;
  BlockSet *pBVar4;
  size_type sVar5;
  LoopShape *pLVar6;
  Shape *pSVar7;
  BlockSet *in_R8;
  _Hash_node_base *p_Var8;
  _List_node_base *p_Var9;
  __node_base_ptr *pp_Var10;
  __node_base_ptr *pp_Var11;
  _Hash_node_base *p_Var12;
  undefined1 local_100 [8];
  BlockSet Queue;
  BlockSet InnerBlocks;
  Block *Prev;
  key_type local_50;
  Block *Curr;
  undefined8 *local_40;
  BlockSet *local_38;
  
  Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node._M_size =
       (size_t)&InnerBlocks.Map._M_h._M_rehash_policy._M_next_resize;
  InnerBlocks.Map._M_h._M_buckets = (__buckets_ptr)0x1;
  InnerBlocks.Map._M_h._M_bucket_count = 0;
  InnerBlocks.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  InnerBlocks.Map._M_h._M_element_count._0_4_ = 0x3f800000;
  InnerBlocks.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  InnerBlocks.Map._M_h._M_rehash_policy._4_4_ = 0;
  InnerBlocks.Map._M_h._M_rehash_policy._M_next_resize = 0;
  InnerBlocks.Map._M_h._M_single_bucket = (__node_base_ptr)&InnerBlocks.Map._M_h._M_single_bucket;
  InnerBlocks.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  InnerBlocks.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)InnerBlocks.Map._M_h._M_single_bucket;
  Curr = (Block *)NextEntries;
  local_40 = (undefined8 *)this;
  local_38 = Entries;
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)local_100,Entries);
  if (Queue.Map._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    do {
      local_50 = (key_type)Queue.Map._M_h._M_single_bucket[2]._M_nxt;
      ::wasm::InsertOrderedSet<CFG::Block_*>::erase
                ((InsertOrderedSet<CFG::Block_*> *)local_100,
                 (iterator)Queue.Map._M_h._M_single_bucket);
      sVar5 = std::
              _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                          _M_impl._M_node._M_size,&local_50);
      if (sVar5 == 0) {
        ::wasm::InsertOrderedSet<CFG::Block_*>::insert
                  ((InsertOrderedSet<CFG::Block_*> *)
                   &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl
                    ._M_node._M_size,&local_50);
        ::wasm::InsertOrderedSet<CFG::Block_*>::erase(Blocks,&local_50);
        pBVar4 = &local_50->BranchesIn;
        for (p_Var9 = (local_50->BranchesIn).List.
                      super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
                      super__List_node_base._M_next; p_Var9 != (_List_node_base *)&pBVar4->List;
            p_Var9 = p_Var9->_M_next) {
          InnerBlocks.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
          _M_node._M_size = (size_t)p_Var9[1]._M_next;
          ::wasm::InsertOrderedSet<CFG::Block_*>::insert
                    ((InsertOrderedSet<CFG::Block_*> *)local_100,
                     (Block **)
                     &InnerBlocks.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>
                      ._M_impl._M_node._M_size);
        }
      }
    } while (Queue.Map._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
  }
  if (InnerBlocks.Map._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    if (InnerBlocks.Map._M_h._M_single_bucket !=
        (__node_base_ptr)&InnerBlocks.Map._M_h._M_single_bucket) {
      p_Var8 = InnerBlocks.Map._M_h._M_single_bucket;
      do {
        p_Var2 = p_Var8[2]._M_nxt;
        for (p_Var12 = p_Var2[8]._M_nxt; p_Var12 != p_Var2 + 8; p_Var12 = p_Var12->_M_nxt) {
          sVar5 = std::
                  _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&Queue.List.
                              super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                              _M_node._M_size,(key_type *)(p_Var12 + 2));
          if (sVar5 == 0) {
            ::wasm::InsertOrderedSet<CFG::Block_*>::insert
                      ((InsertOrderedSet<CFG::Block_*> *)Curr,(Block **)(p_Var12 + 2));
          }
        }
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)&InnerBlocks.Map._M_h._M_single_bucket);
    }
    pLVar6 = AddLoopShape((Relooper *)*local_40);
    plVar1 = &local_38->List;
    p_Var9 = (_List_node_base *)plVar1;
    while( true ) {
      p_Var9 = (((_List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&p_Var9->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var9 == (_List_node_base *)plVar1) break;
      Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::Shape*,wasm::InsertOrderedSet<CFG::Block_>__
                (p_Var9[1]._M_next,(Block *)0x2,(FlowType)pLVar6,
                 (Shape *)&Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                           _M_impl._M_node._M_size,in_R8);
    }
    pp_Var10 = &(Curr->BranchesOut).Map._M_h._M_single_bucket;
    pp_Var11 = pp_Var10;
    while (pBVar4 = local_38, pp_Var11 = &(*pp_Var11)->_M_nxt, pp_Var11 != pp_Var10) {
      Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::Shape*,wasm::InsertOrderedSet<CFG::Block_>__
                (((__node_base_ptr)(pp_Var11 + 2))->_M_nxt,(Block *)0x1,(FlowType)pLVar6,
                 (Shape *)&Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                           _M_impl._M_node._M_size,in_R8);
    }
    pSVar7 = Process(wasm::InsertOrderedSet<CFG::Block*>&,wasm::InsertOrderedSet<CFG::Block_>__
                       (local_40,(BlockSet *)
                                 &Queue.List.
                                  super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                                  _M_impl._M_node._M_size,local_38);
    pLVar6->Inner = pSVar7;
    ::wasm::InsertOrderedSet<CFG::Block_*>::operator=(&pLVar6->Entries,pBVar4);
    while (Queue.Map._M_h._M_single_bucket != (__node_base_ptr)&Queue.Map._M_h._M_single_bucket) {
      p_Var8 = (Queue.Map._M_h._M_single_bucket)->_M_nxt;
      operator_delete(Queue.Map._M_h._M_single_bucket,0x18);
      Queue.Map._M_h._M_single_bucket = p_Var8;
    }
    std::
    _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_100);
    p_Var3 = InnerBlocks.Map._M_h._M_single_bucket;
    while (p_Var3 != (__node_base_ptr)&InnerBlocks.Map._M_h._M_single_bucket) {
      p_Var8 = p_Var3->_M_nxt;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var8;
    }
    std::
    _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                      _M_impl._M_node._M_size);
    return &pLVar6->super_Shape;
  }
  __assert_fail("InnerBlocks.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                ,0x48a,
                "Shape *CFG::Relooper::Calculate(Block *)::Analyzer::MakeLoop(BlockSet &, BlockSet &, BlockSet &)"
               );
}

Assistant:

Shape*
    MakeLoop(BlockSet& Blocks, BlockSet& Entries, BlockSet& NextEntries) {
      // Find the inner blocks in this loop. Proceed backwards from the entries
      // until you reach a seen block, collecting as you go.
      BlockSet InnerBlocks;
      BlockSet Queue = Entries;
      while (Queue.size() > 0) {
        Block* Curr = *(Queue.begin());
        Queue.erase(Queue.begin());
        if (!contains(InnerBlocks, Curr)) {
          // This element is new, mark it as inner and remove from outer
          InnerBlocks.insert(Curr);
          Blocks.erase(Curr);
          // Add the elements prior to it
          for (auto* Prev : Curr->BranchesIn) {
            Queue.insert(Prev);
          }
#if 0
          // Add elements it leads to, if they are dead ends. There is no reason not to hoist dead ends
          // into loops, as it can avoid multiple entries after the loop
          for (auto iter = Curr->BranchesOut.begin(); iter != Curr->BranchesOut.end(); iter++) {
            Block* Target = iter->first;
            if (Target->BranchesIn.size() <= 1 && Target->BranchesOut.size() == 0) {
              Queue.insert(Target);
            }
          }
#endif
        }
      }
      assert(InnerBlocks.size() > 0);

      for (auto* Curr : InnerBlocks) {
        for (auto& [Possible, _] : Curr->BranchesOut) {
          if (!contains(InnerBlocks, Possible)) {
            NextEntries.insert(Possible);
          }
        }
      }

#if 0
      // We can avoid multiple next entries by hoisting them into the loop.
      if (NextEntries.size() > 1) {
        BlockBlockSetMap IndependentGroups;
        FindIndependentGroups(NextEntries, IndependentGroups, &InnerBlocks);

        while (IndependentGroups.size() > 0 && NextEntries.size() > 1) {
          Block* Min = nullptr;
          int MinSize = 0;
          for (auto iter = IndependentGroups.begin(); iter != IndependentGroups.end(); iter++) {
            Block* Entry = iter->first;
            BlockSet &Blocks = iter->second;
            if (!Min || Blocks.size() < MinSize) { // TODO: code size, not # of blocks
              Min = Entry;
              MinSize = Blocks.size();
            }
          }
          // check how many new entries this would cause
          BlockSet &Hoisted = IndependentGroups[Min];
          bool abort = false;
          for (auto iter = Hoisted.begin(); iter != Hoisted.end() && !abort; iter++) {
            Block* Curr = *iter;
            for (auto iter = Curr->BranchesOut.begin(); iter != Curr->BranchesOut.end(); iter++) {
              Block* Target = iter->first;
              if (!contains(Hoisted, Target) && !contains(NextEntries, Target)) {
                // abort this hoisting
                abort = true;
                break;
              }
            }
          }
          if (abort) {
            IndependentGroups.erase(Min);
            continue;
          }
          // hoist this entry
          PrintDebug("hoisting %d into loop\n", Min->Id);
          NextEntries.erase(Min);
          for (auto iter = Hoisted.begin(); iter != Hoisted.end(); iter++) {
            Block* Curr = *iter;
            InnerBlocks.insert(Curr);
            Blocks.erase(Curr);
          }
          IndependentGroups.erase(Min);
        }
      }
#endif

      PrintDebug("creating loop block:\n", 0);
      DebugDump(InnerBlocks, "  inner blocks:");
      DebugDump(Entries, "  inner entries:");
      DebugDump(Blocks, "  outer blocks:");
      DebugDump(NextEntries, "  outer entries:");

      LoopShape* Loop = Parent->AddLoopShape();

      // Solipsize the loop, replacing with break/continue and marking branches
      // as Processed (will not affect later calculations) A. Branches to the
      // loop entries become a continue to this shape
      for (auto* Entry : Entries) {
        Solipsize(Entry, Branch::Continue, Loop, InnerBlocks);
      }
      // B. Branches to outside the loop (a next entry) become breaks on this
      // shape
      for (auto* Next : NextEntries) {
        Solipsize(Next, Branch::Break, Loop, InnerBlocks);
      }
      // Finish up
      Shape* Inner = Process(InnerBlocks, Entries);
      Loop->Inner = Inner;
      Loop->Entries = Entries;
      return Loop;
    }